

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::EnumDescriptorTest_FindValueByName_Test::TestBody
          (EnumDescriptorTest_FindValueByName_Test *this)

{
  EnumValueDescriptor *pEVar1;
  pointer *__ptr;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr_1;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  AssertHelper local_40;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  name._M_str = "FOO";
  name._M_len = 3;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       EnumDescriptor::FindValueByName((this->super_EnumDescriptorTest).enum_,name);
  testing::internal::
  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
            ((internal *)local_38,"foo_","enum_->FindValueByName(\"FOO\")",
             &(this->super_EnumDescriptorTest).foo_,(EnumValueDescriptor **)&local_50);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x6ec,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((EnumValueDescriptor *)local_50._M_head_impl != (EnumValueDescriptor *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  name_00._M_str = "BAR";
  name_00._M_len = 3;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       EnumDescriptor::FindValueByName((this->super_EnumDescriptorTest).enum_,name_00);
  testing::internal::
  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
            ((internal *)local_38,"bar_","enum_->FindValueByName(\"BAR\")",
             &(this->super_EnumDescriptorTest).bar_,(EnumValueDescriptor **)&local_50);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x6ed,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((EnumValueDescriptor *)local_50._M_head_impl != (EnumValueDescriptor *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  name_01._M_str = "FOO";
  name_01._M_len = 3;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       EnumDescriptor::FindValueByName((this->super_EnumDescriptorTest).enum2_,name_01);
  testing::internal::
  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
            ((internal *)local_38,"foo2_","enum2_->FindValueByName(\"FOO\")",
             &(this->super_EnumDescriptorTest).foo2_,(EnumValueDescriptor **)&local_50);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x6ee,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((EnumValueDescriptor *)local_50._M_head_impl != (EnumValueDescriptor *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  name_02._M_str = "BAZ";
  name_02._M_len = 3;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       EnumDescriptor::FindValueByName((this->super_EnumDescriptorTest).enum2_,name_02);
  testing::internal::
  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
            ((internal *)local_38,"baz2_","enum2_->FindValueByName(\"BAZ\")",
             &(this->super_EnumDescriptorTest).baz2_,(EnumValueDescriptor **)&local_50);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x6ef,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((EnumValueDescriptor *)local_50._M_head_impl != (EnumValueDescriptor *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  name_03._M_str = "NO_SUCH_VALUE";
  name_03._M_len = 0xd;
  pEVar1 = EnumDescriptor::FindValueByName((this->super_EnumDescriptorTest).enum_,name_03);
  local_50._M_head_impl._0_1_ = pEVar1 == (EnumValueDescriptor *)0x0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pEVar1 != (EnumValueDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_38,(internal *)&local_50,
               (AssertionResult *)"enum_->FindValueByName(\"NO_SUCH_VALUE\") == nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x6f1,(char *)CONCAT71(local_38._1_7_,local_38[0]));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._1_7_,local_38[0]) != &local_28) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_38._1_7_,local_38[0]),local_28._M_allocated_capacity + 1);
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_58.data_ + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  name_04._M_str = "BAZ";
  name_04._M_len = 3;
  pEVar1 = EnumDescriptor::FindValueByName((this->super_EnumDescriptorTest).enum_,name_04);
  local_50._M_head_impl._0_1_ = pEVar1 == (EnumValueDescriptor *)0x0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pEVar1 != (EnumValueDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_38,(internal *)&local_50,
               (AssertionResult *)"enum_->FindValueByName(\"BAZ\") == nullptr","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x6f2,(char *)CONCAT71(local_38._1_7_,local_38[0]));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._1_7_,local_38[0]) != &local_28) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_38._1_7_,local_38[0]),local_28._M_allocated_capacity + 1);
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_58.data_ + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  name_05._M_str = "BAR";
  name_05._M_len = 3;
  pEVar1 = EnumDescriptor::FindValueByName((this->super_EnumDescriptorTest).enum2_,name_05);
  local_50._M_head_impl._0_1_ = pEVar1 == (EnumValueDescriptor *)0x0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pEVar1 != (EnumValueDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_38,(internal *)&local_50,
               (AssertionResult *)"enum2_->FindValueByName(\"BAR\") == nullptr","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x6f3,(char *)CONCAT71(local_38._1_7_,local_38[0]));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._1_7_,local_38[0]) != &local_28) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_38._1_7_,local_38[0]),local_28._M_allocated_capacity + 1);
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_58.data_ + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TEST_F(EnumDescriptorTest, FindValueByName) {
  EXPECT_EQ(foo_, enum_->FindValueByName("FOO"));
  EXPECT_EQ(bar_, enum_->FindValueByName("BAR"));
  EXPECT_EQ(foo2_, enum2_->FindValueByName("FOO"));
  EXPECT_EQ(baz2_, enum2_->FindValueByName("BAZ"));

  EXPECT_TRUE(enum_->FindValueByName("NO_SUCH_VALUE") == nullptr);
  EXPECT_TRUE(enum_->FindValueByName("BAZ") == nullptr);
  EXPECT_TRUE(enum2_->FindValueByName("BAR") == nullptr);
}